

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi__uint16 * stbi__convert_format16(stbi__uint16 *data,int img_n,int req_comp,uint x,uint y)

{
  ushort *puVar1;
  int iVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  stbi__uint16 *psVar5;
  int iVar6;
  ushort *puVar7;
  ushort *puVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  stbi__uint16 *psVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  
  if (req_comp != img_n) {
    psVar5 = (stbi__uint16 *)malloc((ulong)(req_comp * x * y * 2));
    if (psVar5 == (stbi__uint16 *)0x0) {
      free(data);
      data = (stbi__uint16 *)0x0;
      stbi__g_failure_reason = "outofmem";
    }
    else {
      auVar15[8] = 0xff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15[9] = 0xff;
      auVar15[10] = 0xff;
      auVar15[0xb] = 0xff;
      auVar15[0xc] = 0xff;
      auVar15[0xd] = 0xff;
      auVar15[0xe] = 0xff;
      auVar15[0xf] = 0xff;
      iVar2 = req_comp + img_n * 8;
      iVar6 = x - 1;
      uVar9 = 0;
      uVar13 = 0;
      for (uVar14 = 0; uVar14 != (~((int)y >> 0x1f) & y); uVar14 = uVar14 + 1) {
        if (iVar2 - 10U < 0x1a) {
          iVar10 = (int)uVar14 * x;
          puVar8 = data + (uint)(iVar10 * img_n);
          psVar12 = psVar5 + (uint)(iVar10 * req_comp);
          switch(iVar2) {
          case 10:
            lVar11 = 0;
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              psVar5[uVar9 + lVar11] = *(stbi__uint16 *)((long)data + lVar11 + uVar13 * 2);
              psVar5[uVar9 + lVar11 + 1] = 0xffff;
              lVar11 = lVar11 + 2;
            }
            break;
          case 0xb:
            puVar7 = psVar5 + uVar9 + 2;
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              uVar3 = *puVar8;
              puVar8 = puVar8 + 1;
              *puVar7 = uVar3;
              puVar7[-1] = uVar3;
              puVar7[-2] = uVar3;
              puVar7 = puVar7 + 3;
            }
            break;
          case 0xc:
            lVar11 = 0;
            iVar10 = iVar6;
            while (-1 < iVar10) {
              auVar4 = vpinsrw_avx(auVar15,(uint)*(ushort *)((long)data + lVar11 + uVar13 * 2),0);
              iVar10 = iVar10 + -1;
              auVar4 = vpshuflw_avx(auVar4,0x40);
              *(long *)(psVar5 + uVar9 + lVar11 * 2) = auVar4._0_8_;
              lVar11 = lVar11 + 2;
            }
            break;
          case 0x11:
            lVar11 = 0;
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              *(stbi__uint16 *)((long)psVar5 + lVar11 + uVar9 * 2) = data[uVar13 + lVar11];
              lVar11 = lVar11 + 2;
            }
            break;
          case 0x13:
            puVar7 = psVar5 + uVar9 + 2;
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              uVar3 = *puVar8;
              puVar8 = puVar8 + 2;
              *puVar7 = uVar3;
              puVar7[-1] = uVar3;
              puVar7[-2] = uVar3;
              puVar7 = puVar7 + 3;
            }
            break;
          case 0x14:
            lVar11 = 0;
            iVar10 = iVar6;
            while (-1 < iVar10) {
              iVar10 = iVar10 + -1;
              auVar4 = vpshuflw_avx(ZEXT416(*(uint *)((long)data + lVar11 + uVar13 * 2)),0x40);
              *(long *)(psVar5 + uVar9 + lVar11) = auVar4._0_8_;
              lVar11 = lVar11 + 4;
            }
            break;
          case 0x19:
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              uVar3 = *puVar8;
              puVar7 = puVar8 + 1;
              puVar1 = puVar8 + 2;
              puVar8 = puVar8 + 3;
              *psVar12 = (stbi__uint16)
                         ((uint)*puVar1 * 0x1d + (uint)*puVar7 * 0x96 + (uint)uVar3 * 0x4d >> 8);
              psVar12 = psVar12 + 1;
            }
            break;
          case 0x1a:
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              uVar3 = *puVar8;
              puVar7 = puVar8 + 1;
              puVar1 = puVar8 + 2;
              puVar8 = puVar8 + 3;
              *psVar12 = (stbi__uint16)
                         ((uint)*puVar1 * 0x1d + (uint)*puVar7 * 0x96 + (uint)uVar3 * 0x4d >> 8);
              psVar12[1] = 0xffff;
              psVar12 = psVar12 + 2;
            }
            break;
          case 0x1c:
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              *(undefined4 *)psVar12 = *(undefined4 *)puVar8;
              puVar7 = puVar8 + 2;
              puVar8 = puVar8 + 3;
              psVar12[2] = *puVar7;
              psVar12[3] = 0xffff;
              psVar12 = psVar12 + 4;
            }
            break;
          case 0x21:
            lVar11 = 0;
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              *(short *)((long)psVar5 + lVar11 + uVar9 * 2) =
                   (short)((uint)data[uVar13 + lVar11 * 2 + 2] * 0x1d +
                           (uint)data[uVar13 + lVar11 * 2 + 1] * 0x96 +
                           (uint)data[uVar13 + lVar11 * 2] * 0x4d >> 8);
              lVar11 = lVar11 + 2;
            }
            break;
          case 0x22:
            lVar11 = 0;
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              *(short *)((long)psVar5 + lVar11 + uVar9 * 2) =
                   (short)((uint)data[uVar13 + lVar11 + 2] * 0x1d +
                           (uint)data[uVar13 + lVar11 + 1] * 0x96 +
                           (uint)data[uVar13 + lVar11] * 0x4d >> 8);
              *(stbi__uint16 *)((long)psVar5 + lVar11 + uVar9 * 2 + 2) = data[uVar13 + lVar11 + 3];
              lVar11 = lVar11 + 4;
            }
            break;
          case 0x23:
            for (iVar10 = iVar6; -1 < iVar10; iVar10 = iVar10 + -1) {
              *(undefined4 *)psVar12 = *(undefined4 *)puVar8;
              puVar7 = puVar8 + 2;
              puVar8 = puVar8 + 4;
              psVar12[2] = *puVar7;
              psVar12 = psVar12 + 3;
            }
          }
        }
        uVar13 = (ulong)((int)uVar13 + x * img_n);
        uVar9 = (ulong)((int)uVar9 + req_comp * x);
      }
      free(data);
      data = psVar5;
    }
  }
  return data;
}

Assistant:

static stbi__uint16 *stbi__convert_format16(stbi__uint16 *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   stbi__uint16 *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (stbi__uint16 *) stbi__malloc(req_comp * x * y * 2);
   if (good == NULL) {
      STBI_FREE(data);
      return (stbi__uint16 *) stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      stbi__uint16 *src  = data + j * x * img_n   ;
      stbi__uint16 *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=0xffff;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=0xffff;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                     } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                     } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                     } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=0xffff;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = 0xffff; } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y_16(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                       } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}